

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O3

void forcingStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  void *pvVar1;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 != (void *)0x0) {
    fprintf((FILE *)outfile,"ForcingStep: partition %i: n_stepper_evolves = %li\n",0,
            *(undefined8 *)((long)pvVar1 + 0x10));
    fprintf((FILE *)outfile,"ForcingStep: partition %i: n_stepper_evolves = %li\n",1,
            *(undefined8 *)((long)pvVar1 + 0x18));
    return;
  }
  arkProcessError(ark_mem,-0x15,0x20,"forcingStep_PrintMem",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                  ,"Time step module memory is NULL.");
  return;
}

Assistant:

static void forcingStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output long integer quantities */
  for (int k = 0; k < NUM_PARTITIONS; k++)
  {
    fprintf(outfile, "ForcingStep: partition %i: n_stepper_evolves = %li\n", k,
            step_mem->n_stepper_evolves[k]);
  }
}